

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O2

yyjson_mut_val *
duckdb_yyjson::yyjson_merge_patch(yyjson_mut_doc *doc,yyjson_val *orig,yyjson_val *patch)

{
  yyjson_val_pool *pool;
  void *pvVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  yyjson_mut_val *pyVar5;
  yyjson_mut_val *pyVar6;
  char *pcVar7;
  yyjson_mut_val *pyVar8;
  yyjson_mut_val *pyVar9;
  ulong uVar10;
  ulong uVar11;
  yyjson_val *pyVar12;
  yyjson_val *pyVar13;
  ulong uVar14;
  ulong uVar15;
  yyjson_val *pyVar16;
  bool bVar17;
  yyjson_val *local_50;
  yyjson_val local_orig;
  ulong local_38;
  
  if ((patch == (yyjson_val *)0x0) || ((~(uint)patch->tag & 7) != 0)) {
    pyVar8 = yyjson_val_mut_copy(doc,patch);
    return pyVar8;
  }
  if (doc != (yyjson_mut_doc *)0x0) {
    pool = &doc->val_pool;
    pyVar8 = (doc->val_pool).cur;
    if ((doc->val_pool).end == pyVar8) {
      bVar17 = unsafe_yyjson_val_pool_grow(pool,&doc->alc,1);
      if (!bVar17) {
        return (yyjson_mut_val *)0x0;
      }
      pyVar8 = pool->cur;
    }
    pool->cur = pyVar8 + 1;
    if (pyVar8 != (yyjson_mut_val *)0x0) {
      pyVar8->tag = 7;
      local_orig.tag = 0;
      local_orig.uni.u64 = 0;
      if ((orig == (yyjson_val *)0x0) || ((~(uint)orig->tag & 7) != 0)) {
        local_50 = (yyjson_val *)&local_38;
        local_orig.tag = pyVar8->tag;
        local_orig.uni = pyVar8->uni;
        orig = &local_orig;
      }
      else {
        local_50 = orig + 1;
        if (&local_orig != orig) {
          local_38 = orig->tag >> 8;
          pyVar12 = local_50;
          for (uVar10 = 0; uVar10 != local_38; uVar10 = uVar10 + 1) {
            pvVar1 = (pyVar12->uni).ptr;
            if ((pvVar1 != (void *)0x0) && (((uint)patch->tag & 7) == 7)) {
              uVar15 = pyVar12->tag >> 8;
              uVar11 = patch->tag >> 8;
              pyVar13 = patch;
              while( true ) {
                bVar17 = uVar11 == 0;
                uVar11 = uVar11 - 1;
                if (bVar17) break;
                if ((pyVar13[1].tag >> 8 == uVar15) &&
                   (iVar3 = bcmp(pyVar13[1].uni.ptr,pvVar1,uVar15), iVar3 == 0)) goto LAB_00f0da52;
                pcVar7 = (char *)0x10;
                if ((~(uint)pyVar13[2].tag & 6) == 0) {
                  pcVar7 = pyVar13[2].uni.str;
                }
                pyVar13 = (yyjson_val *)(pcVar7 + (long)&pyVar13[1].tag);
              }
            }
            pyVar5 = yyjson_val_mut_copy(doc,pyVar12);
            pyVar6 = yyjson_val_mut_copy(doc,pyVar12 + 1);
            if (pyVar5 == (yyjson_mut_val *)0x0) {
              return (yyjson_mut_val *)0x0;
            }
            uVar11 = pyVar8->tag;
            if (((uint)uVar11 & 7) != 7) {
              return (yyjson_mut_val *)0x0;
            }
            if (pyVar6 == (yyjson_mut_val *)0x0) {
              return (yyjson_mut_val *)0x0;
            }
            if (((uint)pyVar5->tag & 7) != 5) {
              return (yyjson_mut_val *)0x0;
            }
            pyVar9 = pyVar5;
            if (0xff < uVar11) {
              lVar2 = *(long *)((pyVar8->uni).u64 + 0x10);
              pyVar9 = *(yyjson_mut_val **)(lVar2 + 0x10);
              *(yyjson_mut_val **)(lVar2 + 0x10) = pyVar5;
            }
            pyVar6->next = pyVar9;
            pyVar5->next = pyVar6;
            (pyVar8->uni).str = (char *)pyVar5;
            pyVar8->tag = (uVar11 & 0xff) + (uVar11 & 0xffffffffffffff00) + 0x100;
LAB_00f0da52:
            pcVar7 = (char *)0x10;
            if ((~(uint)pyVar12[1].tag & 6) == 0) {
              pcVar7 = pyVar12[1].uni.str;
            }
            pyVar12 = (yyjson_val *)(pcVar7 + (long)&pyVar12[1].tag);
          }
        }
      }
      uVar11 = 0;
      uVar10 = patch->tag >> 8;
      if ((~(uint)patch->tag & 7) != 0) {
        uVar10 = uVar11;
      }
      pyVar12 = patch + 1;
      do {
        if (uVar11 == uVar10) {
          return pyVar8;
        }
        pyVar13 = pyVar12 + 1;
        uVar4 = (uint)pyVar13->tag;
        if ((uVar4 & 7) != 2) {
          pyVar5 = yyjson_val_mut_copy(doc,pyVar12);
          pvVar1 = (pyVar12->uni).ptr;
          if (pvVar1 == (void *)0x0) {
            pyVar16 = (yyjson_val *)0x0;
          }
          else {
            pyVar16 = (yyjson_val *)0x0;
            if (((uint)orig->tag & 7) == 7) {
              uVar15 = pyVar12->tag >> 8;
              uVar14 = orig->tag >> 8;
              pyVar16 = local_50;
              while (bVar17 = uVar14 != 0, uVar14 = uVar14 - 1, bVar17) {
                if ((pyVar16->tag >> 8 == uVar15) &&
                   (iVar3 = bcmp((pyVar16->uni).ptr,pvVar1,uVar15), iVar3 == 0)) {
                  pyVar16 = pyVar16 + 1;
                  goto LAB_00f0db7e;
                }
                pcVar7 = (char *)0x10;
                if ((~(uint)pyVar16[1].tag & 6) == 0) {
                  pcVar7 = pyVar16[1].uni.str;
                }
                pyVar16 = (yyjson_val *)(pcVar7 + (long)(pyVar16 + 1));
              }
              pyVar16 = (yyjson_val *)0x0;
            }
          }
LAB_00f0db7e:
          pyVar6 = yyjson_merge_patch(doc,pyVar16,pyVar13);
          if (pyVar5 == (yyjson_mut_val *)0x0) {
            return (yyjson_mut_val *)0x0;
          }
          uVar15 = pyVar8->tag;
          if (((uint)uVar15 & 7) != 7) {
            return (yyjson_mut_val *)0x0;
          }
          if (pyVar6 == (yyjson_mut_val *)0x0) {
            return (yyjson_mut_val *)0x0;
          }
          if (((uint)pyVar5->tag & 7) != 5) {
            return (yyjson_mut_val *)0x0;
          }
          pyVar9 = pyVar5;
          if (0xff < uVar15) {
            lVar2 = *(long *)((pyVar8->uni).u64 + 0x10);
            pyVar9 = *(yyjson_mut_val **)(lVar2 + 0x10);
            *(yyjson_mut_val **)(lVar2 + 0x10) = pyVar5;
          }
          pyVar6->next = pyVar9;
          pyVar5->next = pyVar6;
          (pyVar8->uni).str = (char *)pyVar5;
          pyVar8->tag = (uVar15 & 0xffffffffffffff00) + 0x100 + (uVar15 & 0xff);
          uVar4 = (uint)pyVar13->tag;
        }
        pcVar7 = (char *)0x10;
        if ((~uVar4 & 6) == 0) {
          pcVar7 = pyVar12[1].uni.str;
        }
        uVar11 = uVar11 + 1;
        pyVar12 = (yyjson_val *)(pcVar7 + (long)&pyVar13->tag);
      } while( true );
    }
  }
  return (yyjson_mut_val *)0x0;
}

Assistant:

yyjson_mut_val *yyjson_merge_patch(yyjson_mut_doc *doc,
                                   yyjson_val *orig,
                                   yyjson_val *patch) {
    usize idx, max;
    yyjson_val *key, *orig_val, *patch_val, local_orig;
    yyjson_mut_val *builder, *mut_key, *mut_val, *merged_val;

    if (unlikely(!yyjson_is_obj(patch))) {
        return yyjson_val_mut_copy(doc, patch);
    }

    builder = yyjson_mut_obj(doc);
    if (unlikely(!builder)) return NULL;

    memset(&local_orig, 0, sizeof(local_orig));
    if (!yyjson_is_obj(orig)) {
        orig = &local_orig;
        orig->tag = builder->tag;
        orig->uni = builder->uni;
    }

    /* If orig is contributing, copy any items not modified by the patch */
    if (orig != &local_orig) {
        yyjson_obj_foreach(orig, idx, max, key, orig_val) {
            patch_val = yyjson_obj_getn(patch,
                                        unsafe_yyjson_get_str(key),
                                        unsafe_yyjson_get_len(key));
            if (!patch_val) {
                mut_key = yyjson_val_mut_copy(doc, key);
                mut_val = yyjson_val_mut_copy(doc, orig_val);
                if (!yyjson_mut_obj_add(builder, mut_key, mut_val)) return NULL;
            }
        }
    }

    /* Merge items modified by the patch. */
    yyjson_obj_foreach(patch, idx, max, key, patch_val) {
        /* null indicates the field is removed. */
        if (unsafe_yyjson_is_null(patch_val)) {
            continue;
        }
        mut_key = yyjson_val_mut_copy(doc, key);
        orig_val = yyjson_obj_getn(orig,
                                   unsafe_yyjson_get_str(key),
                                   unsafe_yyjson_get_len(key));
        merged_val = yyjson_merge_patch(doc, orig_val, patch_val);
        if (!yyjson_mut_obj_add(builder, mut_key, merged_val)) return NULL;
    }

    return builder;
}